

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_op_subx_int(DisasContext_conflict8 *dc,TCGv_i32 dst,TCGv_i32 src1,TCGv_i32 src2,
                    int update_cc)

{
  uint32_t uVar1;
  TCGContext_conflict8 *tcg_ctx_00;
  TCGv_i32 ret;
  TCGv_i32 carry;
  TCGv_i32 carry_32;
  TCGContext_conflict8 *tcg_ctx;
  int update_cc_local;
  TCGv_i32 src2_local;
  TCGv_i32 src1_local;
  TCGv_i32 dst_local;
  DisasContext_conflict8 *dc_local;
  
  tcg_ctx_00 = dc->uc->tcg_ctx;
  uVar1 = dc->cc_op;
  if (uVar1 == 2) {
LAB_00e68d7b:
    if (update_cc == 0) {
      tcg_gen_sub_i64(tcg_ctx_00,dst,src1,src2);
    }
    else {
      gen_op_sub_cc(tcg_ctx_00,dst,src1,src2);
    }
  }
  else {
    if ((uVar1 == 3) || (uVar1 - 5 < 2)) {
      carry = gen_add32_carry32(tcg_ctx_00);
    }
    else if ((uVar1 == 7) || (uVar1 - 9 < 2)) {
      carry = gen_sub32_carry32(tcg_ctx_00);
    }
    else {
      if (uVar1 == 0xb) goto LAB_00e68d7b;
      carry = tcg_temp_new_i32(tcg_ctx_00);
      gen_helper_compute_C_icc(tcg_ctx_00,carry,tcg_ctx_00->cpu_env);
    }
    ret = tcg_temp_new_i64(tcg_ctx_00);
    tcg_gen_extu_i32_i64_sparc64(tcg_ctx_00,(TCGv_i64)ret,carry);
    tcg_gen_sub_i64(tcg_ctx_00,dst,src1,src2);
    tcg_gen_sub_i64(tcg_ctx_00,dst,dst,ret);
    tcg_temp_free_i32(tcg_ctx_00,carry);
    tcg_temp_free_i64(tcg_ctx_00,ret);
    if (update_cc != 0) {
      tcg_gen_mov_i64_sparc64(tcg_ctx_00,(TCGv_i32)tcg_ctx_00->cpu_cc_src,src1);
      tcg_gen_mov_i64_sparc64(tcg_ctx_00,(TCGv_i32)tcg_ctx_00->cpu_cc_src2,src2);
      tcg_gen_mov_i64_sparc64(tcg_ctx_00,(TCGv_i32)tcg_ctx_00->cpu_cc_dst,dst);
      tcg_gen_movi_i32(tcg_ctx_00,tcg_ctx_00->cpu_cc_op,8);
      dc->cc_op = 8;
    }
  }
  return;
}

Assistant:

static void gen_op_subx_int(DisasContext *dc, TCGv dst, TCGv src1,
                            TCGv src2, int update_cc)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    TCGv_i32 carry_32;
    TCGv carry;

    switch (dc->cc_op) {
    case CC_OP_DIV:
    case CC_OP_LOGIC:
        /* Carry is known to be zero.  Fall back to plain SUB.  */
        if (update_cc) {
            gen_op_sub_cc(tcg_ctx, dst, src1, src2);
        } else {
            tcg_gen_sub_tl(tcg_ctx, dst, src1, src2);
        }
        return;

    case CC_OP_ADD:
    case CC_OP_TADD:
    case CC_OP_TADDTV:
        carry_32 = gen_add32_carry32(tcg_ctx);
        break;

    case CC_OP_SUB:
    case CC_OP_TSUB:
    case CC_OP_TSUBTV:
        if (TARGET_LONG_BITS == 32) {
            /* We can re-use the host's hardware carry generation by using
               a SUB2 opcode.  We discard the low part of the output.
               Ideally we'd combine this operation with the add that
               generated the carry in the first place.  */
            carry = tcg_temp_new(tcg_ctx);
            tcg_gen_sub2_tl(tcg_ctx, carry, dst, tcg_ctx->cpu_cc_src, src1, tcg_ctx->cpu_cc_src2, src2);
            tcg_temp_free(tcg_ctx, carry);
            goto sub_done;
        }
        carry_32 = gen_sub32_carry32(tcg_ctx);
        break;

    default:
        /* We need external help to produce the carry.  */
        carry_32 = tcg_temp_new_i32(tcg_ctx);
        gen_helper_compute_C_icc(tcg_ctx, carry_32, tcg_ctx->cpu_env);
        break;
    }

#if TARGET_LONG_BITS == 64
    carry = tcg_temp_new(tcg_ctx);
    tcg_gen_extu_i32_i64(tcg_ctx, carry, carry_32);
#else
    carry = carry_32;
#endif

    tcg_gen_sub_tl(tcg_ctx, dst, src1, src2);
    tcg_gen_sub_tl(tcg_ctx, dst, dst, carry);

    tcg_temp_free_i32(tcg_ctx, carry_32);
#if TARGET_LONG_BITS == 64
    tcg_temp_free(tcg_ctx, carry);
#endif

 sub_done:
    if (update_cc) {
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_src, src1);
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_src2, src2);
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_dst, dst);
        tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_cc_op, CC_OP_SUBX);
        dc->cc_op = CC_OP_SUBX;
    }
}